

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

errr term_data_init(term_data *td,wchar_t i)

{
  wchar_t wVar1;
  wchar_t wVar2;
  _Bool _Var3;
  errr eVar4;
  wchar_t k;
  int iVar5;
  ang_file *f;
  ushort **ppuVar6;
  char *pcVar7;
  infofnt *piVar8;
  infowin *piVar9;
  XSizeHints *pXVar10;
  ulong *puVar11;
  wchar_t local_630;
  wchar_t local_62c;
  wchar_t local_628;
  wchar_t local_624;
  wchar_t local_620;
  wchar_t local_61c;
  wchar_t local_618;
  wchar_t local_614;
  wchar_t local_610;
  wchar_t local_60c;
  wchar_t local_608;
  wchar_t local_604;
  wchar_t local_600;
  wchar_t local_5fc;
  char local_5f8 [8];
  char font_name [256];
  char cmd [40];
  byte local_4c8 [8];
  char buf [1024];
  ang_file *fff;
  XWMHints *wmh;
  XSizeHints *sh;
  char res_class [20];
  byte local_88 [8];
  char res_name [20];
  XClassHint *ch;
  wchar_t val;
  char *str;
  wchar_t num;
  wchar_t hgt;
  wchar_t wid;
  wchar_t oy;
  wchar_t ox;
  wchar_t rows;
  wchar_t cols;
  wchar_t y;
  wchar_t x;
  char *font;
  char *name;
  term *t;
  wchar_t i_local;
  term_data *td_local;
  
  cols = L'\0';
  rows = L'\0';
  ox = L'P';
  oy = L'\x18';
  wid = L'\x01';
  hgt = L'\x01';
  _y = get_default_font(i);
  f = file_open(settings,MODE_READ,FTYPE_TEXT);
  if (f != (ang_file *)0x0) {
    while (_Var3 = file_getl(f,(char *)local_4c8,0x400), _Var3) {
      if (((local_4c8[0] != 0) &&
          (ppuVar6 = __ctype_b_loc(), ((*ppuVar6)[(int)(uint)local_4c8[0]] & 0x2000) == 0)) &&
         (local_4c8[0] != 0x23)) {
        strnfmt(font_name + 0xf8,0x28,"AT_X_%d",(ulong)(uint)i);
        _Var3 = prefix((char *)local_4c8,font_name + 0xf8);
        if (_Var3) {
          pcVar7 = strstr((char *)local_4c8,"=");
          if (pcVar7 == (char *)0x0) {
            local_5fc = L'\xffffffff';
          }
          else {
            local_5fc = atoi(pcVar7 + 1);
          }
          cols = local_5fc;
        }
        else {
          strnfmt(font_name + 0xf8,0x28,"AT_Y_%d",(ulong)(uint)i);
          _Var3 = prefix((char *)local_4c8,font_name + 0xf8);
          if (_Var3) {
            pcVar7 = strstr((char *)local_4c8,"=");
            if (pcVar7 == (char *)0x0) {
              local_600 = L'\xffffffff';
            }
            else {
              local_600 = atoi(pcVar7 + 1);
            }
            rows = local_600;
          }
          else {
            strnfmt(font_name + 0xf8,0x28,"COLS_%d",(ulong)(uint)i);
            _Var3 = prefix((char *)local_4c8,font_name + 0xf8);
            if (_Var3) {
              pcVar7 = strstr((char *)local_4c8,"=");
              if (pcVar7 == (char *)0x0) {
                local_604 = L'\xffffffff';
              }
              else {
                local_604 = atoi(pcVar7 + 1);
              }
              if (L'\0' < local_604) {
                ox = local_604;
              }
            }
            else {
              strnfmt(font_name + 0xf8,0x28,"ROWS_%d",(ulong)(uint)i);
              _Var3 = prefix((char *)local_4c8,font_name + 0xf8);
              if (_Var3) {
                pcVar7 = strstr((char *)local_4c8,"=");
                if (pcVar7 == (char *)0x0) {
                  local_608 = L'\xffffffff';
                }
                else {
                  local_608 = atoi(pcVar7 + 1);
                }
                if (L'\0' < local_608) {
                  oy = local_608;
                }
              }
              else {
                strnfmt(font_name + 0xf8,0x28,"IBOX_%d",(ulong)(uint)i);
                _Var3 = prefix((char *)local_4c8,font_name + 0xf8);
                if (_Var3) {
                  pcVar7 = strstr((char *)local_4c8,"=");
                  if (pcVar7 == (char *)0x0) {
                    local_60c = L'\xffffffff';
                  }
                  else {
                    local_60c = atoi(pcVar7 + 1);
                  }
                  if (L'\0' < local_60c) {
                    wid = local_60c;
                  }
                }
                else {
                  strnfmt(font_name + 0xf8,0x28,"IBOY_%d",(ulong)(uint)i);
                  _Var3 = prefix((char *)local_4c8,font_name + 0xf8);
                  if (_Var3) {
                    pcVar7 = strstr((char *)local_4c8,"=");
                    if (pcVar7 == (char *)0x0) {
                      local_610 = L'\xffffffff';
                    }
                    else {
                      local_610 = atoi(pcVar7 + 1);
                    }
                    if (L'\0' < local_610) {
                      hgt = local_610;
                    }
                  }
                  else {
                    strnfmt(font_name + 0xf8,0x28,"FONT_%d",(ulong)(uint)i);
                    _Var3 = prefix((char *)local_4c8,font_name + 0xf8);
                    if (_Var3) {
                      pcVar7 = strstr((char *)local_4c8,"=");
                      if (pcVar7 != (char *)0x0) {
                        my_strcpy(local_5f8,pcVar7 + 1,0x100);
                        _y = local_5f8;
                      }
                    }
                    else {
                      strnfmt(font_name + 0xf8,0x28,"TILE_WIDTH_%d",(ulong)(uint)i);
                      _Var3 = prefix((char *)local_4c8,font_name + 0xf8);
                      if (_Var3) {
                        pcVar7 = strstr((char *)local_4c8,"=");
                        if (pcVar7 == (char *)0x0) {
                          local_614 = L'\xffffffff';
                        }
                        else {
                          local_614 = atoi(pcVar7 + 1);
                        }
                        if (L'\0' < local_614) {
                          td->tile_wid = local_614;
                        }
                      }
                      else {
                        strnfmt(font_name + 0xf8,0x28,"TILE_HEIGHT_%d",(ulong)(uint)i);
                        _Var3 = prefix((char *)local_4c8,font_name + 0xf8);
                        if (_Var3) {
                          pcVar7 = strstr((char *)local_4c8,"=");
                          if (pcVar7 == (char *)0x0) {
                            local_618 = L'\xffffffff';
                          }
                          else {
                            local_618 = atoi(pcVar7 + 1);
                          }
                          if (L'\0' < local_618) {
                            td->tile_hgt = local_618;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    file_close(f);
  }
  strnfmt((char *)local_4c8,0x400,"ANGBAND_X11_AT_X_%d",(ulong)(uint)i);
  pcVar7 = getenv((char *)local_4c8);
  if (pcVar7 == (char *)0x0) {
    local_61c = L'\xffffffff';
  }
  else {
    local_61c = atoi(pcVar7);
  }
  if (L'\0' < local_61c) {
    cols = local_61c;
  }
  strnfmt((char *)local_4c8,0x400,"ANGBAND_X11_AT_Y_%d",(ulong)(uint)i);
  pcVar7 = getenv((char *)local_4c8);
  if (pcVar7 == (char *)0x0) {
    local_620 = L'\xffffffff';
  }
  else {
    local_620 = atoi(pcVar7);
  }
  if (L'\0' < local_620) {
    rows = local_620;
  }
  strnfmt((char *)local_4c8,0x400,"ANGBAND_X11_COLS_%d",(ulong)(uint)i);
  pcVar7 = getenv((char *)local_4c8);
  if (pcVar7 == (char *)0x0) {
    local_624 = L'\xffffffff';
  }
  else {
    local_624 = atoi(pcVar7);
  }
  if (L'\0' < local_624) {
    ox = local_624;
  }
  strnfmt((char *)local_4c8,0x400,"ANGBAND_X11_ROWS_%d",(ulong)(uint)i);
  pcVar7 = getenv((char *)local_4c8);
  if (pcVar7 == (char *)0x0) {
    local_628 = L'\xffffffff';
  }
  else {
    local_628 = atoi(pcVar7);
  }
  if (L'\0' < local_628) {
    oy = local_628;
  }
  strnfmt((char *)local_4c8,0x400,"ANGBAND_X11_IBOX_%d",(ulong)(uint)i);
  pcVar7 = getenv((char *)local_4c8);
  if (pcVar7 == (char *)0x0) {
    local_62c = L'\xffffffff';
  }
  else {
    local_62c = atoi(pcVar7);
  }
  if (L'\0' < local_62c) {
    wid = local_62c;
  }
  strnfmt((char *)local_4c8,0x400,"ANGBAND_X11_IBOY_%d",(ulong)(uint)i);
  pcVar7 = getenv((char *)local_4c8);
  if (pcVar7 == (char *)0x0) {
    local_630 = L'\xffffffff';
  }
  else {
    local_630 = atoi(pcVar7);
  }
  if (L'\0' < local_630) {
    hgt = local_630;
  }
  strnfmt((char *)local_4c8,0x400,"ANGBAND_X11_FONT_%d",(ulong)(uint)i);
  pcVar7 = getenv((char *)local_4c8);
  if (pcVar7 != (char *)0x0) {
    _y = pcVar7;
  }
  if (i == L'\0') {
    if (ox < L'P') {
      ox = L'P';
    }
    if (oy < L'\x18') {
      oy = L'\x18';
    }
  }
  piVar8 = (infofnt *)mem_zalloc(0x20);
  td->fnt = piVar8;
  Infofnt = td->fnt;
  eVar4 = Infofnt_init_data(_y);
  if (eVar4 != 0) {
    quit_fmt("Couldn\'t load the requested font. (%s)",_y);
  }
  if (td->tile_wid < L'\x01') {
    td->tile_wid = (int)td->fnt->twid;
  }
  if (td->tile_hgt < L'\x01') {
    td->tile_hgt = (int)td->fnt->hgt;
  }
  td->tile_wid2 = td->tile_wid;
  k = L'\x10';
  if (i == L'\0') {
    k = L'Ѐ';
  }
  wVar1 = td->tile_wid;
  wVar2 = td->tile_hgt;
  piVar9 = (infowin *)mem_zalloc(0x28);
  td->win = piVar9;
  Infowin = td->win;
  Infowin_init_data(0,cols,rows,ox * wVar1 + wid * 2,oy * wVar2 + hgt * 2,L'\0',Metadpy->fg,
                    Metadpy->bg);
  Infowin_set_mask(0x28005);
  Infowin_set_name(angband_term_name[i]);
  Infowin->ox = (int16_t)wid;
  Infowin->oy = (int16_t)hgt;
  register0x00000000 = (XClassHint *)XAllocClassHint();
  if (register0x00000000 == (XClassHint *)0x0) {
    quit("XAllocClassHint failed");
  }
  my_strcpy((char *)local_88,angband_term_name[i],0x14);
  iVar5 = tolower((uint)local_88[0]);
  local_88[0] = (byte)iVar5;
  stack0xffffffffffffff90->res_name = (char *)local_88;
  my_strcpy((char *)&sh,"Angband",0x14);
  stack0xffffffffffffff90->res_class = (char *)&sh;
  XSetClassHint(Metadpy->dpy,Infowin->win,stack0xffffffffffffff90);
  pXVar10 = (XSizeHints *)XAllocSizeHints();
  if (pXVar10 == (XSizeHints *)0x0) {
    quit("XAllocSizeHints failed");
  }
  if ((cols == L'\0') && (rows == L'\0')) {
    pXVar10->flags = 0;
  }
  else {
    pXVar10->flags = 1;
  }
  if (i == L'\0') {
    pXVar10->flags = pXVar10->flags | 0x30;
    pXVar10->min_width = td->tile_wid * 0x50 + wid * 2;
    pXVar10->min_height = td->tile_hgt * 0x18 + hgt * 2;
    pXVar10->max_width = td->tile_wid * 0xff + wid * 2;
    pXVar10->max_height = td->tile_hgt * 0xff + hgt * 2;
  }
  else {
    pXVar10->flags = pXVar10->flags | 0x30;
    pXVar10->min_width = td->tile_wid + wid * 2;
    pXVar10->min_height = td->tile_hgt + hgt * 2;
    pXVar10->max_width = td->tile_wid * 0xff + wid * 2;
    pXVar10->max_height = td->tile_hgt * 0xff + hgt * 2;
  }
  pXVar10->flags = pXVar10->flags | 0x40;
  pXVar10->width_inc = td->tile_wid;
  pXVar10->height_inc = td->tile_hgt;
  pXVar10->flags = pXVar10->flags | 0x100;
  pXVar10->base_width = wid * 2;
  pXVar10->base_height = hgt * 2;
  XSetWMNormalHints(Metadpy->dpy,Infowin->win,pXVar10);
  puVar11 = (ulong *)XAllocWMHints();
  if (puVar11 == (ulong *)0x0) {
    quit("XAllocWMHints failed");
  }
  *puVar11 = *puVar11 | 0x40;
  if (i == L'\0') {
    puVar11[6] = td->win->win;
  }
  else {
    puVar11[6] = (data[0].win)->win;
  }
  XSetWMHints(Metadpy->dpy,Infowin->win,puVar11);
  XFree(puVar11);
  Infowin_map();
  td->sizeh = pXVar10;
  td->classh = stack0xffffffffffffff90;
  if ((L'\xffffffff' < cols) && (L'\xffffffff' < rows)) {
    Infowin_impell(cols,rows);
  }
  term_init(&td->t,ox,oy,k);
  (td->t).soft_cursor = true;
  (td->t).complex_input = true;
  (td->t).xtra_hook = Term_xtra_x11;
  (td->t).curs_hook = Term_curs_x11;
  (td->t).bigcurs_hook = Term_bigcurs_x11;
  (td->t).wipe_hook = Term_wipe_x11;
  (td->t).text_hook = Term_text_x11;
  (td->t).data = td;
  Term_activate(&td->t);
  return 0;
}

Assistant:

static errr term_data_init(term_data *td, int i)
{
	term *t = &td->t;

	const char *name = angband_term_name[i];

	const char *font;

	int x = 0;
	int y = 0;

	int cols = 80;
	int rows = 24;

	int ox = 1;
	int oy = 1;

	int wid, hgt, num;

	const char *str;

	int val;

	XClassHint *ch;

	char res_name[20];
	char res_class[20];

	XSizeHints *sh;

	XWMHints *wmh;

	ang_file *fff;

	char buf[1024];
	char cmd[40];
	char font_name[256];

	/* Get default font for this term */
	font = get_default_font(i);

	/* Open the file */
	fff = file_open(settings, MODE_READ, FTYPE_TEXT);

	/* File exists */
	if (fff) {
		/* Process the file */
		while (file_getl(fff, buf, sizeof(buf))) {
			/* Skip "empty" lines */
			if (!buf[0]) continue;

			/* Skip "blank" lines */
			if (isspace((unsigned char)buf[0])) continue;

			/* Skip comments */
			if (buf[0] == '#') continue;

			/* Window specific location (x) */
			strnfmt(cmd, sizeof(cmd), "AT_X_%d", i);

			if (prefix(buf, cmd)) {
				str = strstr(buf, "=");
				x = (str != NULL) ? atoi(str + 1) : -1;
				continue;
			}

			/* Window specific location (y) */
			strnfmt(cmd, sizeof(cmd), "AT_Y_%d", i);

			if (prefix(buf, cmd)) {
				str = strstr(buf, "=");
				y = (str != NULL) ? atoi(str + 1) : -1;
				continue;
			}

			/* Window specific cols */
			strnfmt(cmd, sizeof(cmd), "COLS_%d", i);

			if (prefix(buf, cmd)) {
				str = strstr(buf, "=");
				val = (str != NULL) ? atoi(str + 1) : -1;
				if (val > 0) cols = val;
				continue;
			}

			/* Window specific rows */
			strnfmt(cmd, sizeof(cmd), "ROWS_%d", i);

			if (prefix(buf, cmd)) {
				str = strstr(buf, "=");
				val = (str != NULL) ? atoi(str + 1) : -1;
				if (val > 0) rows = val;
				continue;
			}

			/* Window specific inner border offset (ox) */
			strnfmt(cmd, sizeof(cmd), "IBOX_%d", i);

			if (prefix(buf, cmd)) {
				str = strstr(buf, "=");
				val = (str != NULL) ? atoi(str + 1) : -1;
				if (val > 0) ox = val;
				continue;
			}

			/* Window specific inner border offset (oy) */
			strnfmt(cmd, sizeof(cmd), "IBOY_%d", i);

			if (prefix(buf, cmd)) {
				str = strstr(buf, "=");
				val = (str != NULL) ? atoi(str + 1) : -1;
				if (val > 0) oy = val;
				continue;
			}

			/* Window specific font name */
			strnfmt(cmd, sizeof(cmd), "FONT_%d", i);

			if (prefix(buf, cmd)) {
				str = strstr(buf, "=");
				if (str != NULL) {
					my_strcpy(font_name, str + 1, sizeof(font_name));
					font = font_name;
				}
				continue;
			}

			/* Window specific tile width */
			strnfmt(cmd, sizeof(cmd), "TILE_WIDTH_%d", i);

			if (prefix(buf, cmd)) {
				str = strstr(buf, "=");
				val = (str != NULL) ? atoi(str + 1) : -1;
				if (val > 0) td->tile_wid = val;
				continue;
			}

			/* Window specific tile height */
			strnfmt(cmd, sizeof(cmd), "TILE_HEIGHT_%d", i);

			if (prefix(buf, cmd)) {
				str = strstr(buf, "=");
				val = (str != NULL) ? atoi(str + 1) : -1;
				if (val > 0) td->tile_hgt = val;
				continue;
			}
		}

		/* Close */
		file_close(fff);
	}

	/*
	 * Env-vars overwrite the settings in the settings file
	 */

	/* Window specific location (x) */
	strnfmt(buf, sizeof(buf), "ANGBAND_X11_AT_X_%d", i);
	str = getenv(buf);
	val = (str != NULL) ? atoi(str) : -1;
	if (val > 0) x = val;

	/* Window specific location (y) */
	strnfmt(buf, sizeof(buf), "ANGBAND_X11_AT_Y_%d", i);
	str = getenv(buf);
	val = (str != NULL) ? atoi(str) : -1;
	if (val > 0) y = val;

	/* Window specific cols */
	strnfmt(buf, sizeof(buf), "ANGBAND_X11_COLS_%d", i);
	str = getenv(buf);
	val = (str != NULL) ? atoi(str) : -1;
	if (val > 0) cols = val;

	/* Window specific rows */
	strnfmt(buf, sizeof(buf), "ANGBAND_X11_ROWS_%d", i);
	str = getenv(buf);
	val = (str != NULL) ? atoi(str) : -1;
	if (val > 0) rows = val;

	/* Window specific inner border offset (ox) */
	strnfmt(buf, sizeof(buf), "ANGBAND_X11_IBOX_%d", i);
	str = getenv(buf);
	val = (str != NULL) ? atoi(str) : -1;
	if (val > 0) ox = val;

	/* Window specific inner border offset (oy) */
	strnfmt(buf, sizeof(buf), "ANGBAND_X11_IBOY_%d", i);
	str = getenv(buf);
	val = (str != NULL) ? atoi(str) : -1;
	if (val > 0) oy = val;

	/* Window specific font name */
	strnfmt(buf, sizeof(buf), "ANGBAND_X11_FONT_%d", i);
	str = getenv(buf);
	if (str) font = str;

	/* Hack the main window must be at least 80x24 */
	if (!i) {
		if (cols < 80) cols = 80;
		if (rows < 24) rows = 24;
	}

	/* Prepare the standard font */
	td->fnt = mem_zalloc(sizeof(infofnt));
	Infofnt_set(td->fnt);
	if (Infofnt_init_data(font))
		quit_fmt("Couldn't load the requested font. (%s)", font);

	/* Use proper tile size */
	if (td->tile_wid <= 0) td->tile_wid = td->fnt->twid;
	if (td->tile_hgt <= 0) td->tile_hgt = td->fnt->hgt;

	/* Don't allow bigtile mode - one day maybe NRM */
	td->tile_wid2 = td->tile_wid;

	/* Hack -- key buffer size */
	num = ((i == 0) ? 1024 : 16);

	/* Assume full size windows */
	wid = cols * td->tile_wid + (ox + ox);
	hgt = rows * td->tile_hgt + (oy + oy);

	/* Create a top-window */
	td->win = mem_zalloc(sizeof(infowin));
	Infowin_set(td->win);
	Infowin_init_top(x, y, wid, hgt, 0, Metadpy->fg, Metadpy->bg);

	/* Ask for certain events */
	Infowin_set_mask(ExposureMask | StructureNotifyMask | KeyPressMask
			 | ButtonPressMask);

	/* Set the window name */
	Infowin_set_name(name);

	/* Save the inner border */
	Infowin->ox = ox;
	Infowin->oy = oy;

	/* Make Class Hints */
	ch = XAllocClassHint();

	if (ch == NULL) quit("XAllocClassHint failed");

	my_strcpy(res_name, name, sizeof(res_name));
	res_name[0] = tolower((unsigned char)res_name[0]);
	ch->res_name = res_name;

	my_strcpy(res_class, "Angband", sizeof(res_class));
	ch->res_class = res_class;

	XSetClassHint(Metadpy->dpy, Infowin->win, ch);

	/* Make Size Hints */
	sh = XAllocSizeHints();

	/* Oops */
	if (sh == NULL) quit("XAllocSizeHints failed");

	if (x || y)
		sh->flags = USPosition;
	else
		sh->flags = 0;

	/* Main window has a differing minimum size */
	if (i == 0) {
		/* Main window min size is 80x24 */
		sh->flags |= (PMinSize | PMaxSize);
		sh->min_width = 80 * td->tile_wid + (ox + ox);
		sh->min_height = 24 * td->tile_hgt + (oy + oy);
		sh->max_width = 255 * td->tile_wid + (ox + ox);
		sh->max_height = 255 * td->tile_hgt + (oy + oy);
	} else {
		/* Other windows */
		sh->flags |= (PMinSize | PMaxSize);
		sh->min_width = td->tile_wid + (ox + ox);
		sh->min_height = td->tile_hgt + (oy + oy);
		sh->max_width = 255 * td->tile_wid + (ox + ox);
		sh->max_height = 255 * td->tile_hgt + (oy + oy);
	}

	/* Resize increment */
	sh->flags |= PResizeInc;
	sh->width_inc = td->tile_wid;
	sh->height_inc = td->tile_hgt;

	/* Base window size */
	sh->flags |= PBaseSize;
	sh->base_width = (ox + ox);
	sh->base_height = (oy + oy);

	/* Use the size hints */
	XSetWMNormalHints(Metadpy->dpy, Infowin->win, sh);

	/* WMHints */
	wmh = XAllocWMHints();

	if(wmh == NULL) quit("XAllocWMHints failed");

	wmh->flags |= WindowGroupHint;

	if(i == 0) {
		// root points to itself
		wmh->window_group = td->win->win;
	} else {
		// others point to root
		wmh->window_group = data[0].win->win;
	}
	XSetWMHints(Metadpy->dpy, Infowin->win, wmh);
	XFree(wmh);

	/* Map the window */
	Infowin_map();

	/* Set pointers to allocated data */
	td->sizeh = sh;
	td->classh = ch;

	/* Move the window to requested location */
	if ((x >= 0) && (y >= 0)) Infowin_impell(x, y);


	/* Initialize the term */
	term_init(t, cols, rows, num);

	/* Use a "soft" cursor */
	t->soft_cursor = true;

	/* Differentiate between BS/^h, Tab/^i, etc. */
	t->complex_input = true;

	/* Hooks */
	t->xtra_hook = Term_xtra_x11;
	t->curs_hook = Term_curs_x11;
	t->bigcurs_hook = Term_bigcurs_x11;
	t->wipe_hook = Term_wipe_x11;
	t->text_hook = Term_text_x11;

	/* Save the data */
	t->data = td;

	/* Activate (important) */
	Term_activate(t);

	/* Success */
	return (0);
}